

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O3

void __thiscall
gutil::Properties::putValue<gmath::SVector<double,3>>
          (Properties *this,char *key,SVector<double,_3> *value)

{
  ostringstream out;
  undefined1 *local_1b8;
  undefined1 local_1a8 [16];
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  gmath::operator<<((basic_ostream<char,_std::char_traits<char>_> *)local_198,value);
  std::__cxx11::stringbuf::str();
  gutil::Properties::putString((char *)this,(string *)key);
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void putValue(const char *key, const T &value)
    {
      std::ostringstream out;
      out << value;
      putString(key, out.str());
    }